

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O3

uint64 __thiscall osc::ReceivedMessageArgument::AsTimeTag(ReceivedMessageArgument *this)

{
  uint64 uVar1;
  undefined8 *puVar2;
  pointer_____offset_0x10___ *ppuVar3;
  
  if (this->typeTagPtr_ == (char *)0x0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar2[1] = "missing argument";
    *puVar2 = &PTR__exception_00178c90;
    ppuVar3 = &MissingArgumentException::typeinfo;
  }
  else {
    if (*this->typeTagPtr_ == 't') {
      uVar1 = AsTimeTagUnchecked(this);
      return uVar1;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar2[1] = "wrong argument type";
    *puVar2 = &PTR__exception_00178cb8;
    ppuVar3 = &WrongArgumentTypeException::typeinfo;
  }
  __cxa_throw(puVar2,ppuVar3,std::exception::~exception);
}

Assistant:

uint64 ReceivedMessageArgument::AsTimeTag() const
{
    if( !typeTagPtr_ )
        throw MissingArgumentException();
	else if( *typeTagPtr_ == TIME_TAG_TYPE_TAG )
		return AsTimeTagUnchecked();
	else
		throw WrongArgumentTypeException();
}